

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O1

void vkt::shaderexecutor::anon_unknown_0::declareUniformIndexVars
               (ostream *str,deUint32 bindingLocation,char *varPrefix,int numVars)

{
  ostream *poVar1;
  int iVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"layout(set = ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<(str,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", binding = ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", std140) uniform Indices\n{\n",0x1c);
  if (0 < (int)varPrefix) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(str,"\thighp int ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(str,"index",5);
      poVar1 = (ostream *)std::ostream::operator<<(str,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      iVar2 = iVar2 + 1;
    } while ((int)varPrefix != iVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str,"};\n",3);
  return;
}

Assistant:

static void declareUniformIndexVars (std::ostream& str, deUint32 bindingLocation, const char* varPrefix, int numVars)
{
	str << "layout(set = " << EXTRA_RESOURCES_DESCRIPTOR_SET_INDEX << ", binding = " << bindingLocation << ", std140) uniform Indices\n{\n";

	for (int varNdx = 0; varNdx < numVars; varNdx++)
		str << "\thighp int " << varPrefix << varNdx << ";\n";

	str << "};\n";
}